

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_json.cpp
# Opt level: O0

void __thiscall Json_Whitespace_Test::TestBody(Json_Whitespace_Test *this)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar1;
  json_out_callbacks *this_00;
  bool bVar2;
  int iVar3;
  parser<json_out_callbacks> *ppVar4;
  char *pcVar5;
  char *in_R9;
  AssertHelper local_bf0;
  Message local_be8;
  coord local_be0;
  coord local_bd8;
  undefined1 local_bd0 [8];
  AssertionResult gtest_ar_11;
  Message local_bb8;
  undefined1 local_bb0 [8];
  AssertionResult gtest_ar_10;
  AssertHelper local_b80;
  Message local_b78;
  bool local_b69;
  undefined1 local_b68 [8];
  AssertionResult gtest_ar__5;
  string res_5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b18;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_af8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_ad8;
  string local_ab8;
  undefined1 local_a98 [8];
  parser<json_out_callbacks> p6;
  Message local_9d8;
  coord local_9d0;
  coord local_9c8;
  undefined1 local_9c0 [8];
  AssertionResult gtest_ar_9;
  Message local_9a8;
  undefined1 local_9a0 [8];
  AssertionResult gtest_ar_8;
  AssertHelper local_970;
  Message local_968;
  bool local_959;
  undefined1 local_958 [8];
  AssertionResult gtest_ar__4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_928;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_908;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_8e8;
  undefined1 local_8c8 [8];
  string res_4;
  undefined1 local_888 [8];
  parser<json_out_callbacks> p5;
  Message local_7c8;
  coord local_7c0;
  coord local_7b8;
  undefined1 local_7b0 [8];
  AssertionResult gtest_ar_7;
  Message local_798;
  undefined1 local_790 [8];
  AssertionResult gtest_ar_6;
  AssertHelper local_760;
  Message local_758;
  bool local_749;
  undefined1 local_748 [8];
  AssertionResult gtest_ar__3;
  string res_3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_6f8;
  string local_6d8;
  undefined1 local_6b8 [8];
  parser<json_out_callbacks> p4;
  Message local_5f8;
  coord local_5f0;
  coord local_5e8;
  undefined1 local_5e0 [8];
  AssertionResult gtest_ar_5;
  Message local_5c8;
  undefined1 local_5c0 [8];
  AssertionResult gtest_ar_4;
  AssertHelper local_590;
  Message local_588;
  bool local_579;
  undefined1 local_578 [8];
  AssertionResult gtest_ar__2;
  string res_2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_528;
  string local_508;
  undefined1 local_4e8 [8];
  parser<json_out_callbacks> p3;
  Message local_428;
  coord local_420;
  coord local_418;
  undefined1 local_410 [8];
  AssertionResult gtest_ar_3;
  Message local_3f8;
  undefined1 local_3f0 [8];
  AssertionResult gtest_ar_2;
  AssertHelper local_3c0;
  Message local_3b8;
  bool local_3a9;
  undefined1 local_3a8 [8];
  AssertionResult gtest_ar__1;
  string res_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_358;
  string local_338;
  undefined1 local_310 [8];
  parser<json_out_callbacks> p2;
  undefined1 local_250 [4];
  uint xord;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> keyword;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> crlf;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> lf;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> cr;
  Message local_1c8;
  coord local_1c0;
  coord local_1b8;
  undefined1 local_1b0 [8];
  AssertionResult gtest_ar_1;
  Message local_198;
  undefined1 local_190 [8];
  AssertionResult gtest_ar;
  AssertHelper local_160;
  Message local_158;
  bool local_149;
  undefined1 local_148 [8];
  AssertionResult gtest_ar_;
  undefined1 local_118 [8];
  string res;
  string local_e8;
  undefined1 local_c8 [8];
  parser<json_out_callbacks> p1;
  Json_Whitespace_Test *this_local;
  
  local_e8.field_2._M_allocated_capacity = 0;
  local_e8.field_2._8_8_ = 0;
  local_e8._M_dataplus = (_Alloc_hider)0x0;
  local_e8._1_7_ = 0;
  local_e8._M_string_length = 0;
  p1.coordinate_ = (coord)this;
  json_out_callbacks::json_out_callbacks((json_out_callbacks *)&local_e8);
  pstore::json::parser<json_out_callbacks>::parser
            ((parser<json_out_callbacks> *)local_c8,(json_out_callbacks *)&local_e8,none);
  json_out_callbacks::~json_out_callbacks((json_out_callbacks *)&local_e8);
  s_abi_cxx11_((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               &gtest_ar_.message_,"   \t    null",0xc);
  ppVar4 = pstore::json::parser<json_out_callbacks>::input
                     ((parser<json_out_callbacks> *)local_c8,(string *)&gtest_ar_.message_);
  pstore::json::parser<json_out_callbacks>::eof_abi_cxx11_((result_type *)local_118,ppVar4);
  std::__cxx11::string::~string((string *)&gtest_ar_.message_);
  local_149 = pstore::json::parser<json_out_callbacks>::has_error
                        ((parser<json_out_callbacks> *)local_c8);
  local_149 = !local_149;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_148,&local_149,(type *)0x0);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_148);
  if (!bVar2) {
    testing::Message::Message(&local_158);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar.message_,(internal *)local_148,
               (AssertionResult *)"p1.has_error ()","true","false",in_R9);
    pcVar5 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_160,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/json/test_json.cpp"
               ,0x47,pcVar5);
    testing::internal::AssertHelper::operator=(&local_160,&local_158);
    testing::internal::AssertHelper::~AssertHelper(&local_160);
    std::__cxx11::string::~string((string *)&gtest_ar.message_);
    testing::Message::~Message(&local_158);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_148);
  testing::internal::EqHelper::
  Compare<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char[5],_nullptr>
            ((EqHelper *)local_190,"res","\"null\"",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_118,
             (char (*) [5])0x1f2e6d);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_190);
  if (!bVar2) {
    testing::Message::Message(&local_198);
    pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_190);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/json/test_json.cpp"
               ,0x48,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,&local_198);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(&local_198);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_190);
  local_1b8 = pstore::json::parser<json_out_callbacks>::coordinate
                        ((parser<json_out_callbacks> *)local_c8);
  pstore::json::coord::coord(&local_1c0,0xd,1);
  testing::internal::EqHelper::Compare<pstore::json::coord,_pstore::json::coord,_nullptr>
            ((EqHelper *)local_1b0,"p1.coordinate ()","(json::coord{13U, 1U})",&local_1b8,&local_1c0
            );
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1b0);
  if (!bVar2) {
    testing::Message::Message(&local_1c8);
    pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_1b0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)((long)&cr.field_2 + 8),kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/json/test_json.cpp"
               ,0x49,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)((long)&cr.field_2 + 8),&local_1c8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)((long)&cr.field_2 + 8));
    testing::Message::~Message(&local_1c8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1b0);
  std::__cxx11::string::~string((string *)local_118);
  pstore::json::parser<json_out_callbacks>::~parser((parser<json_out_callbacks> *)local_c8);
  s_abi_cxx11_((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               ((long)&lf.field_2 + 8),"\r",1);
  s_abi_cxx11_((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               ((long)&crlf.field_2 + 8),"\n",1);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&keyword.field_2 + 8),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&lf.field_2 + 8),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&crlf.field_2 + 8));
  s_abi_cxx11_((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_250,"null"
               ,4);
  iVar3 = std::__cxx11::string::length();
  p2.coordinate_.row = iVar3 + 1;
  local_338.field_2._M_allocated_capacity = 0;
  local_338.field_2._8_8_ = 0;
  local_338._M_dataplus = (_Alloc_hider)0x0;
  local_338._1_7_ = 0;
  local_338._M_string_length = 0;
  json_out_callbacks::json_out_callbacks((json_out_callbacks *)&local_338);
  pstore::json::parser<json_out_callbacks>::parser
            ((parser<json_out_callbacks> *)local_310,(json_out_callbacks *)&local_338,none);
  json_out_callbacks::~json_out_callbacks((json_out_callbacks *)&local_338);
  pbVar1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           ((long)&crlf.field_2 + 8);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&res_1.field_2 + 8),pbVar1,pbVar1);
  std::operator+(&local_358,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&res_1.field_2 + 8),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_250);
  pstore::json::parser<json_out_callbacks>::input
            ((parser<json_out_callbacks> *)local_310,&local_358);
  std::__cxx11::string::~string((string *)&local_358);
  std::__cxx11::string::~string((string *)(res_1.field_2._M_local_buf + 8));
  pstore::json::parser<json_out_callbacks>::eof_abi_cxx11_
            ((result_type *)&gtest_ar__1.message_,(parser<json_out_callbacks> *)local_310);
  local_3a9 = pstore::json::parser<json_out_callbacks>::has_error
                        ((parser<json_out_callbacks> *)local_310);
  local_3a9 = !local_3a9;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_3a8,&local_3a9,(type *)0x0);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_3a8);
  if (!bVar2) {
    testing::Message::Message(&local_3b8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar_2.message_,(internal *)local_3a8,
               (AssertionResult *)"p2.has_error ()","true","false",in_R9);
    pcVar5 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_3c0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/json/test_json.cpp"
               ,0x56,pcVar5);
    testing::internal::AssertHelper::operator=(&local_3c0,&local_3b8);
    testing::internal::AssertHelper::~AssertHelper(&local_3c0);
    std::__cxx11::string::~string((string *)&gtest_ar_2.message_);
    testing::Message::~Message(&local_3b8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_3a8);
  testing::internal::EqHelper::
  Compare<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nullptr>
            ((EqHelper *)local_3f0,"res","keyword",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             &gtest_ar__1.message_,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_250);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_3f0);
  if (!bVar2) {
    testing::Message::Message(&local_3f8);
    pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_3f0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_3.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/json/test_json.cpp"
               ,0x57,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3.message_,&local_3f8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3.message_);
    testing::Message::~Message(&local_3f8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_3f0);
  local_418 = pstore::json::parser<json_out_callbacks>::coordinate
                        ((parser<json_out_callbacks> *)local_310);
  pstore::json::coord::coord(&local_420,p2.coordinate_.row,3);
  testing::internal::EqHelper::Compare<pstore::json::coord,_pstore::json::coord,_nullptr>
            ((EqHelper *)local_410,"p2.coordinate ()","(json::coord{xord, 3U})",&local_418,
             &local_420);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_410);
  if (!bVar2) {
    testing::Message::Message(&local_428);
    pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_410);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&p3.coordinate_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/json/test_json.cpp"
               ,0x58,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&p3.coordinate_,&local_428);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&p3.coordinate_);
    testing::Message::~Message(&local_428);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_410);
  std::__cxx11::string::~string((string *)&gtest_ar__1.message_);
  pstore::json::parser<json_out_callbacks>::~parser((parser<json_out_callbacks> *)local_310);
  local_508.field_2._M_allocated_capacity = 0;
  local_508.field_2._8_8_ = 0;
  local_508._M_dataplus = (_Alloc_hider)0x0;
  local_508._1_7_ = 0;
  local_508._M_string_length = 0;
  json_out_callbacks::json_out_callbacks((json_out_callbacks *)&local_508);
  pstore::json::parser<json_out_callbacks>::parser
            ((parser<json_out_callbacks> *)local_4e8,(json_out_callbacks *)&local_508,none);
  json_out_callbacks::~json_out_callbacks((json_out_callbacks *)&local_508);
  pbVar1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           ((long)&lf.field_2 + 8);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&res_2.field_2 + 8),pbVar1,pbVar1);
  std::operator+(&local_528,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&res_2.field_2 + 8),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_250);
  pstore::json::parser<json_out_callbacks>::input
            ((parser<json_out_callbacks> *)local_4e8,&local_528);
  std::__cxx11::string::~string((string *)&local_528);
  std::__cxx11::string::~string((string *)(res_2.field_2._M_local_buf + 8));
  pstore::json::parser<json_out_callbacks>::eof_abi_cxx11_
            ((result_type *)&gtest_ar__2.message_,(parser<json_out_callbacks> *)local_4e8);
  local_579 = pstore::json::parser<json_out_callbacks>::has_error
                        ((parser<json_out_callbacks> *)local_4e8);
  local_579 = !local_579;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_578,&local_579,(type *)0x0);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_578);
  if (!bVar2) {
    testing::Message::Message(&local_588);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar_4.message_,(internal *)local_578,
               (AssertionResult *)"p3.has_error ()","true","false",in_R9);
    pcVar5 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_590,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/json/test_json.cpp"
               ,0x5e,pcVar5);
    testing::internal::AssertHelper::operator=(&local_590,&local_588);
    testing::internal::AssertHelper::~AssertHelper(&local_590);
    std::__cxx11::string::~string((string *)&gtest_ar_4.message_);
    testing::Message::~Message(&local_588);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_578);
  testing::internal::EqHelper::
  Compare<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nullptr>
            ((EqHelper *)local_5c0,"res","keyword",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             &gtest_ar__2.message_,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_250);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_5c0);
  if (!bVar2) {
    testing::Message::Message(&local_5c8);
    pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_5c0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_5.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/json/test_json.cpp"
               ,0x5f,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_5.message_,&local_5c8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_5.message_);
    testing::Message::~Message(&local_5c8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_5c0);
  local_5e8 = pstore::json::parser<json_out_callbacks>::coordinate
                        ((parser<json_out_callbacks> *)local_4e8);
  pstore::json::coord::coord(&local_5f0,p2.coordinate_.row,3);
  testing::internal::EqHelper::Compare<pstore::json::coord,_pstore::json::coord,_nullptr>
            ((EqHelper *)local_5e0,"p3.coordinate ()","(json::coord{xord, 3U})",&local_5e8,
             &local_5f0);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_5e0);
  if (!bVar2) {
    testing::Message::Message(&local_5f8);
    pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_5e0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&p4.coordinate_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/json/test_json.cpp"
               ,0x60,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&p4.coordinate_,&local_5f8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&p4.coordinate_);
    testing::Message::~Message(&local_5f8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_5e0);
  std::__cxx11::string::~string((string *)&gtest_ar__2.message_);
  pstore::json::parser<json_out_callbacks>::~parser((parser<json_out_callbacks> *)local_4e8);
  local_6d8.field_2._M_allocated_capacity = 0;
  local_6d8.field_2._8_8_ = 0;
  local_6d8._M_dataplus = (_Alloc_hider)0x0;
  local_6d8._1_7_ = 0;
  local_6d8._M_string_length = 0;
  json_out_callbacks::json_out_callbacks((json_out_callbacks *)&local_6d8);
  pstore::json::parser<json_out_callbacks>::parser
            ((parser<json_out_callbacks> *)local_6b8,(json_out_callbacks *)&local_6d8,none);
  json_out_callbacks::~json_out_callbacks((json_out_callbacks *)&local_6d8);
  pbVar1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           ((long)&keyword.field_2 + 8);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&res_3.field_2 + 8),pbVar1,pbVar1);
  std::operator+(&local_6f8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&res_3.field_2 + 8),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_250);
  pstore::json::parser<json_out_callbacks>::input
            ((parser<json_out_callbacks> *)local_6b8,&local_6f8);
  std::__cxx11::string::~string((string *)&local_6f8);
  std::__cxx11::string::~string((string *)(res_3.field_2._M_local_buf + 8));
  pstore::json::parser<json_out_callbacks>::eof_abi_cxx11_
            ((result_type *)&gtest_ar__3.message_,(parser<json_out_callbacks> *)local_6b8);
  local_749 = pstore::json::parser<json_out_callbacks>::has_error
                        ((parser<json_out_callbacks> *)local_6b8);
  local_749 = !local_749;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_748,&local_749,(type *)0x0);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_748);
  if (!bVar2) {
    testing::Message::Message(&local_758);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar_6.message_,(internal *)local_748,
               (AssertionResult *)"p4.has_error ()","true","false",in_R9);
    pcVar5 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_760,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/json/test_json.cpp"
               ,0x66,pcVar5);
    testing::internal::AssertHelper::operator=(&local_760,&local_758);
    testing::internal::AssertHelper::~AssertHelper(&local_760);
    std::__cxx11::string::~string((string *)&gtest_ar_6.message_);
    testing::Message::~Message(&local_758);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_748);
  testing::internal::EqHelper::
  Compare<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nullptr>
            ((EqHelper *)local_790,"res","keyword",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             &gtest_ar__3.message_,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_250);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_790);
  if (!bVar2) {
    testing::Message::Message(&local_798);
    pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_790);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_7.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/json/test_json.cpp"
               ,0x67,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_7.message_,&local_798);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_7.message_);
    testing::Message::~Message(&local_798);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_790);
  local_7b8 = pstore::json::parser<json_out_callbacks>::coordinate
                        ((parser<json_out_callbacks> *)local_6b8);
  pstore::json::coord::coord(&local_7c0,p2.coordinate_.row,3);
  testing::internal::EqHelper::Compare<pstore::json::coord,_pstore::json::coord,_nullptr>
            ((EqHelper *)local_7b0,"p4.coordinate ()","(json::coord{xord, 3U})",&local_7b8,
             &local_7c0);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_7b0);
  if (!bVar2) {
    testing::Message::Message(&local_7c8);
    pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_7b0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&p5.coordinate_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/json/test_json.cpp"
               ,0x68,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&p5.coordinate_,&local_7c8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&p5.coordinate_);
    testing::Message::~Message(&local_7c8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_7b0);
  std::__cxx11::string::~string((string *)&gtest_ar__3.message_);
  pstore::json::parser<json_out_callbacks>::~parser((parser<json_out_callbacks> *)local_6b8);
  res_4.field_2._8_8_ = 0;
  this_00 = (json_out_callbacks *)((long)&res_4.field_2 + 8);
  json_out_callbacks::json_out_callbacks(this_00);
  pstore::json::parser<json_out_callbacks>::parser
            ((parser<json_out_callbacks> *)local_888,this_00,none);
  json_out_callbacks::~json_out_callbacks((json_out_callbacks *)((long)&res_4.field_2 + 8));
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &gtest_ar__4.message_,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&crlf.field_2 + 8),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&lf.field_2 + 8));
  std::operator+(&local_928,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &gtest_ar__4.message_,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&crlf.field_2 + 8));
  std::operator+(&local_908,&local_928,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&lf.field_2 + 8));
  std::operator+(&local_8e8,&local_908,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_250);
  ppVar4 = pstore::json::parser<json_out_callbacks>::input
                     ((parser<json_out_callbacks> *)local_888,&local_8e8);
  pstore::json::parser<json_out_callbacks>::eof_abi_cxx11_((result_type *)local_8c8,ppVar4);
  std::__cxx11::string::~string((string *)&local_8e8);
  std::__cxx11::string::~string((string *)&local_908);
  std::__cxx11::string::~string((string *)&local_928);
  std::__cxx11::string::~string((string *)&gtest_ar__4.message_);
  local_959 = pstore::json::parser<json_out_callbacks>::has_error
                        ((parser<json_out_callbacks> *)local_888);
  local_959 = !local_959;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_958,&local_959,(type *)0x0);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_958);
  if (!bVar2) {
    testing::Message::Message(&local_968);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar_8.message_,(internal *)local_958,
               (AssertionResult *)"p5.has_error ()","true","false",in_R9);
    pcVar5 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_970,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/json/test_json.cpp"
               ,0x6f,pcVar5);
    testing::internal::AssertHelper::operator=(&local_970,&local_968);
    testing::internal::AssertHelper::~AssertHelper(&local_970);
    std::__cxx11::string::~string((string *)&gtest_ar_8.message_);
    testing::Message::~Message(&local_968);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_958);
  testing::internal::EqHelper::
  Compare<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nullptr>
            ((EqHelper *)local_9a0,"res","keyword",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_8c8,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_250);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_9a0);
  if (!bVar2) {
    testing::Message::Message(&local_9a8);
    pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_9a0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_9.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/json/test_json.cpp"
               ,0x70,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_9.message_,&local_9a8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_9.message_);
    testing::Message::~Message(&local_9a8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_9a0);
  local_9c8 = pstore::json::parser<json_out_callbacks>::coordinate
                        ((parser<json_out_callbacks> *)local_888);
  pstore::json::coord::coord(&local_9d0,p2.coordinate_.row,4);
  testing::internal::EqHelper::Compare<pstore::json::coord,_pstore::json::coord,_nullptr>
            ((EqHelper *)local_9c0,"p5.coordinate ()","(json::coord{xord, 4U})",&local_9c8,
             &local_9d0);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_9c0);
  if (!bVar2) {
    testing::Message::Message(&local_9d8);
    pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_9c0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&p6.coordinate_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/json/test_json.cpp"
               ,0x71,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&p6.coordinate_,&local_9d8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&p6.coordinate_);
    testing::Message::~Message(&local_9d8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_9c0);
  std::__cxx11::string::~string((string *)local_8c8);
  pstore::json::parser<json_out_callbacks>::~parser((parser<json_out_callbacks> *)local_888);
  local_ab8.field_2._M_allocated_capacity = 0;
  local_ab8.field_2._8_8_ = 0;
  local_ab8._M_dataplus = (_Alloc_hider)0x0;
  local_ab8._1_7_ = 0;
  local_ab8._M_string_length = 0;
  json_out_callbacks::json_out_callbacks((json_out_callbacks *)&local_ab8);
  pstore::json::parser<json_out_callbacks>::parser
            ((parser<json_out_callbacks> *)local_a98,(json_out_callbacks *)&local_ab8,none);
  json_out_callbacks::~json_out_callbacks((json_out_callbacks *)&local_ab8);
  pbVar1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           ((long)&crlf.field_2 + 8);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&res_5.field_2 + 8),pbVar1,pbVar1);
  std::operator+(&local_b18,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&res_5.field_2 + 8),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&keyword.field_2 + 8));
  std::operator+(&local_af8,&local_b18,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&lf.field_2 + 8));
  std::operator+(&local_ad8,&local_af8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_250);
  pstore::json::parser<json_out_callbacks>::input
            ((parser<json_out_callbacks> *)local_a98,&local_ad8);
  std::__cxx11::string::~string((string *)&local_ad8);
  std::__cxx11::string::~string((string *)&local_af8);
  std::__cxx11::string::~string((string *)&local_b18);
  std::__cxx11::string::~string((string *)(res_5.field_2._M_local_buf + 8));
  pstore::json::parser<json_out_callbacks>::eof_abi_cxx11_
            ((result_type *)&gtest_ar__5.message_,(parser<json_out_callbacks> *)local_a98);
  local_b69 = pstore::json::parser<json_out_callbacks>::has_error
                        ((parser<json_out_callbacks> *)local_a98);
  local_b69 = !local_b69;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_b68,&local_b69,(type *)0x0);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_b68);
  if (!bVar2) {
    testing::Message::Message(&local_b78);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar_10.message_,(internal *)local_b68,
               (AssertionResult *)"p6.has_error ()","true","false",in_R9);
    pcVar5 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_b80,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/json/test_json.cpp"
               ,0x77,pcVar5);
    testing::internal::AssertHelper::operator=(&local_b80,&local_b78);
    testing::internal::AssertHelper::~AssertHelper(&local_b80);
    std::__cxx11::string::~string((string *)&gtest_ar_10.message_);
    testing::Message::~Message(&local_b78);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_b68);
  testing::internal::EqHelper::
  Compare<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char[5],_nullptr>
            ((EqHelper *)local_bb0,"res","\"null\"",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             &gtest_ar__5.message_,(char (*) [5])0x1f2e6d);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_bb0);
  if (!bVar2) {
    testing::Message::Message(&local_bb8);
    pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_bb0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_11.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/json/test_json.cpp"
               ,0x78,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_11.message_,&local_bb8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_11.message_);
    testing::Message::~Message(&local_bb8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_bb0);
  local_bd8 = pstore::json::parser<json_out_callbacks>::coordinate
                        ((parser<json_out_callbacks> *)local_a98);
  pstore::json::coord::coord(&local_be0,p2.coordinate_.row,5);
  testing::internal::EqHelper::Compare<pstore::json::coord,_pstore::json::coord,_nullptr>
            ((EqHelper *)local_bd0,"p6.coordinate ()","(json::coord{xord, 5U})",&local_bd8,
             &local_be0);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_bd0);
  if (!bVar2) {
    testing::Message::Message(&local_be8);
    pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_bd0);
    testing::internal::AssertHelper::AssertHelper
              (&local_bf0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/json/test_json.cpp"
               ,0x79,pcVar5);
    testing::internal::AssertHelper::operator=(&local_bf0,&local_be8);
    testing::internal::AssertHelper::~AssertHelper(&local_bf0);
    testing::Message::~Message(&local_be8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_bd0);
  std::__cxx11::string::~string((string *)&gtest_ar__5.message_);
  pstore::json::parser<json_out_callbacks>::~parser((parser<json_out_callbacks> *)local_a98);
  std::__cxx11::string::~string((string *)local_250);
  std::__cxx11::string::~string((string *)(keyword.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)(crlf.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)(lf.field_2._M_local_buf + 8));
  return;
}

Assistant:

TEST_F (Json, Whitespace) {
    {
        json::parser<json_out_callbacks> p1;
        std::string const res = p1.input ("   \t    null"s).eof ();
        EXPECT_FALSE (p1.has_error ());
        EXPECT_EQ (res, "null");
        EXPECT_EQ (p1.coordinate (), (json::coord{13U, 1U}));
    }

    auto const cr = "\r"s;
    auto const lf = "\n"s;
    auto const crlf = cr + lf;
    auto const keyword = "null"s;
    auto const xord = static_cast<unsigned> (keyword.length ()) + 1U;

    {
        json::parser<json_out_callbacks> p2;
        p2.input (lf + lf + keyword); // POSIX-style line endings
        std::string const res = p2.eof ();
        EXPECT_FALSE (p2.has_error ());
        EXPECT_EQ (res, keyword);
        EXPECT_EQ (p2.coordinate (), (json::coord{xord, 3U}));
    }
    {
        json::parser<json_out_callbacks> p3;
        p3.input (cr + cr + keyword); // MacOS Classic line endings
        std::string const res = p3.eof ();
        EXPECT_FALSE (p3.has_error ());
        EXPECT_EQ (res, keyword);
        EXPECT_EQ (p3.coordinate (), (json::coord{xord, 3U}));
    }
    {
        json::parser<json_out_callbacks> p4;
        p4.input (crlf + crlf + keyword); // Windows-style CRLF
        std::string const res = p4.eof ();
        EXPECT_FALSE (p4.has_error ());
        EXPECT_EQ (res, keyword);
        EXPECT_EQ (p4.coordinate (), (json::coord{xord, 3U}));
    }
    {
        json::parser<json_out_callbacks> p5;
        // Nobody's line-endings. Each counts as a new line. Note that the middle cr+lf pair will
        // match a single Windows crlf.
        std::string const res = p5.input (lf + cr + lf + cr + keyword).eof ();
        EXPECT_FALSE (p5.has_error ());
        EXPECT_EQ (res, keyword);
        EXPECT_EQ (p5.coordinate (), (json::coord{xord, 4U}));
    }
    {
        json::parser<json_out_callbacks> p6;
        p6.input (lf + lf + crlf + cr + keyword); // A groovy mixture of line-ending characters.
        std::string const res = p6.eof ();
        EXPECT_FALSE (p6.has_error ());
        EXPECT_EQ (res, "null");
        EXPECT_EQ (p6.coordinate (), (json::coord{xord, 5U}));
    }
}